

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ImplicitWeakMessage::_InternalSerialize
          (ImplicitWeakMessage *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int size;
  void *data;
  uint8 *puVar1;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  ImplicitWeakMessage *this_local;
  
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  puVar1 = io::EpsCopyOutputStream::WriteRaw(stream,data,size,target);
  return puVar1;
}

Assistant:

uint8* _InternalSerialize(uint8* target,
                            io::EpsCopyOutputStream* stream) const final {
    return stream->WriteRaw(data_.data(), static_cast<int>(data_.size()),
                            target);
  }